

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local.cpp
# Opt level: O0

HLOCAL LocalAlloc(UINT uFlags,SIZE_T uBytes)

{
  int iVar1;
  HANDLE hHeap;
  LPVOID local_20;
  LPVOID lpRetVal;
  SIZE_T uBytes_local;
  UINT uFlags_local;
  
  local_20 = (LPVOID)0x0;
  uBytes_local._4_4_ = uFlags;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  iVar1 = AllocFlagsToHeapAllocFlags(uFlags,(PUINT)((long)&uBytes_local + 4));
  if (iVar1 != 0) {
    hHeap = GetProcessHeap();
    local_20 = HeapAlloc(hHeap,uBytes_local._4_4_,uBytes);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return local_20;
  }
  abort();
}

Assistant:

HLOCAL
PALAPI
LocalAlloc(
	   IN UINT uFlags,
	   IN SIZE_T uBytes)
{
    LPVOID lpRetVal = NULL;
    PERF_ENTRY(LocalAlloc);
    ENTRY("LocalAlloc (uFlags=%#x, uBytes=%u)\n", uFlags, uBytes);

    if (!AllocFlagsToHeapAllocFlags (uFlags, &uFlags)) {
        goto done;
    }

    lpRetVal = HeapAlloc( GetProcessHeap(), uFlags, uBytes );

done:
    LOGEXIT( "LocalAlloc returning %p.\n", lpRetVal );
    PERF_EXIT(LocalAlloc);
    return (HLOCAL) lpRetVal;
}